

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRunner.cpp
# Opt level: O0

void __thiscall
UnitTest::TestRunner::RunTest
          (TestRunner *this,TestResults *result,Test *curTest,int maxTestTimeInMs)

{
  TestResults **ppTVar1;
  ostream *poVar2;
  char *failure;
  undefined1 local_1d8 [8];
  MemoryOutStream stream;
  double testTimeInMs;
  Timer testTimer;
  int maxTestTimeInMs_local;
  Test *curTest_local;
  TestResults *result_local;
  TestRunner *this_local;
  
  testTimer.m_startTime.tv_usec._4_4_ = maxTestTimeInMs;
  ppTVar1 = CurrentTest::Results();
  *ppTVar1 = result;
  Timer::Timer((Timer *)&testTimeInMs);
  Timer::Start((Timer *)&testTimeInMs);
  TestResults::OnTestStart(result,&curTest->m_details);
  Test::Run(curTest);
  stream._400_8_ = Timer::GetTimeInMs((Timer *)&testTimeInMs);
  if (((0 < testTimer.m_startTime.tv_usec._4_4_) &&
      ((double)testTimer.m_startTime.tv_usec._4_4_ < (double)stream._400_8_)) &&
     ((curTest->m_timeConstraintExempt & 1U) == 0)) {
    MemoryOutStream::MemoryOutStream((MemoryOutStream *)local_1d8);
    poVar2 = std::operator<<((ostream *)local_1d8,"Global time constraint failed. Expected under ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,testTimer.m_startTime.tv_usec._4_4_);
    poVar2 = std::operator<<(poVar2,"ms but took ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(double)stream._400_8_);
    std::operator<<(poVar2,"ms.");
    failure = MemoryOutStream::GetText((MemoryOutStream *)local_1d8);
    TestResults::OnTestFailure(result,&curTest->m_details,failure);
    MemoryOutStream::~MemoryOutStream((MemoryOutStream *)local_1d8);
  }
  TestResults::OnTestFinish(result,&curTest->m_details,(float)((double)stream._400_8_ / 1000.0));
  return;
}

Assistant:

void TestRunner::RunTest(TestResults* const result, Test* const curTest, int const maxTestTimeInMs) const
{
	CurrentTest::Results() = result;

	Timer testTimer;
	testTimer.Start();

	result->OnTestStart(curTest->m_details);

	curTest->Run();

	double const testTimeInMs = testTimer.GetTimeInMs();
	if (maxTestTimeInMs > 0 && testTimeInMs > maxTestTimeInMs && !curTest->m_timeConstraintExempt)
	{
	    MemoryOutStream stream;
	    stream << "Global time constraint failed. Expected under " << maxTestTimeInMs <<
	            "ms but took " << testTimeInMs << "ms.";

	    result->OnTestFailure(curTest->m_details, stream.GetText());
	}

	result->OnTestFinish(curTest->m_details, static_cast<float>(testTimeInMs/1000.0));
}